

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O3

void aux_lines(lua_State *L,int toclose)

{
  int iVar1;
  int idx;
  bool bVar2;
  
  iVar1 = lua_gettop(L);
  if (0x12 < iVar1) {
    luaL_argerror(L,0x11,"too many options");
  }
  lua_pushvalue(L,1);
  lua_pushinteger(L,(long)(iVar1 + -1));
  lua_pushboolean(L,toclose);
  if (1 < iVar1) {
    idx = 2;
    do {
      lua_pushvalue(L,idx);
      bVar2 = idx != iVar1;
      idx = idx + 1;
    } while (bVar2);
  }
  lua_pushcclosure(L,io_readline,iVar1 + 2);
  return;
}

Assistant:

static void aux_lines (lua_State *L, int toclose) {
  int i;
  int n = lua_gettop(L) - 1;  /* number of arguments to read */
  /* ensure that arguments will fit here and into 'io_readline' stack */
  luaL_argcheck(L, n <= LUA_MINSTACK - 3, LUA_MINSTACK - 3, "too many options");
  lua_pushvalue(L, 1);  /* file handle */
  lua_pushinteger(L, n);  /* number of arguments to read */
  lua_pushboolean(L, toclose);  /* close/not close file when finished */
  for (i = 1; i <= n; i++) lua_pushvalue(L, i + 1);  /* copy arguments */
  lua_pushcclosure(L, io_readline, 3 + n);
}